

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O1

int setlineno(int n)

{
  char *pcVar1;
  mgwin *pmVar2;
  line *plVar3;
  line *plVar4;
  int iVar5;
  
  pmVar2 = curwp;
  if (n < 0) {
    curwp->w_dotline = curwp->w_bufp->b_lines + n;
    plVar4 = curbp->b_headp->l_bp;
    do {
      plVar3 = plVar4->l_bp;
      if (plVar3 == curbp->b_headp) {
        pmVar2->w_dotline = 1;
        plVar3 = plVar4;
        break;
      }
      n = n + 1;
      plVar4 = plVar3;
    } while (n != 0);
  }
  else {
    iVar5 = n + (uint)(n == 0);
    curwp->w_dotline = iVar5;
    iVar5 = iVar5 + 1;
    plVar4 = curbp->b_headp->l_fp;
    do {
      plVar3 = plVar4;
      iVar5 = iVar5 + -1;
      if (iVar5 < 2) goto LAB_0010858f;
      plVar4 = plVar3->l_fp;
    } while (plVar3->l_fp != curbp->b_headp);
    pmVar2->w_dotline = pmVar2->w_bufp->b_lines;
  }
LAB_0010858f:
  pmVar2 = curwp;
  curwp->w_dotp = plVar3;
  pmVar2->w_doto = 0;
  pcVar1 = &pmVar2->w_rflag;
  *pcVar1 = *pcVar1 | 2;
  return 1;
}

Assistant:

int
setlineno(int n)
{
	struct line  *clp;

	if (n >= 0) {
		if (n == 0)
			n++;
		curwp->w_dotline = n;
		clp = lforw(curbp->b_headp);	/* "clp" is first line */
		while (--n > 0) {
			if (lforw(clp) == curbp->b_headp) {
				curwp->w_dotline = curwp->w_bufp->b_lines;
				break;
			}
			clp = lforw(clp);
		}
	} else {
		curwp->w_dotline = curwp->w_bufp->b_lines + n;
		clp = lback(curbp->b_headp);	/* "clp" is last line */
		while (n < 0) {
			if (lback(clp) == curbp->b_headp) {
				curwp->w_dotline = 1;
				break;
			}
			clp = lback(clp);
			n++;
		}
	}
	curwp->w_dotp = clp;
	curwp->w_doto = 0;
	curwp->w_rflag |= WFMOVE;
	return (TRUE);
}